

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_mod.cpp
# Opt level: O3

void Commands::SetX(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Command_Source *from,string *set)

{
  pointer pcVar1;
  World *pWVar2;
  byte bVar3;
  string *psVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  Character *pCVar10;
  Character *pCVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pbVar12;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  mapped_type *pmVar13;
  undefined4 extraout_var_22;
  uchar uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  size_type *psVar18;
  uint uVar19;
  long lVar20;
  bool bVar21;
  PacketBuilder builder;
  string title_string;
  undefined1 local_178 [48];
  Character *local_148;
  string *local_140;
  int local_138;
  int local_134;
  key_type local_130;
  size_type *local_110 [2];
  size_type local_100 [2];
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  iVar5 = (*from->_vptr_Command_Source[4])(from);
  pbVar12 = (arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (pbVar12->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + pbVar12->_M_string_length);
  pCVar10 = World::GetCharacter((World *)CONCAT44(extraout_var,iVar5),&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar5 = (*from->_vptr_Command_Source[3])(from);
  pCVar11 = (Character *)CONCAT44(extraout_var_00,iVar5);
  if ((pCVar10 == (Character *)0x0) || (pCVar10->nowhere == true)) {
    iVar5 = (*from->_vptr_Command_Source[4])(from);
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"character_not_found","");
    I18N::Format<>(&local_70,(I18N *)(CONCAT44(extraout_var_01,iVar5) + 0x490),(string *)local_178);
    (*from->_vptr_Command_Source[5])(from,&local_70);
    local_b0.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    local_b0._M_dataplus._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_00121386:
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_140 = set;
    iVar5 = (**(pCVar10->super_Command_Source)._vptr_Command_Source)(pCVar10);
    iVar6 = (**from->_vptr_Command_Source)(from);
    if ((pCVar10 == pCVar11) || ((byte)iVar5 < (byte)iVar6)) {
      if (((pCVar11 == (Character *)0x0) || (pCVar10 == pCVar11)) ||
         ((pCVar11->nointeract & 0x10) == 0)) {
        local_110[0] = local_100;
        local_148 = pCVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
        pbVar12 = (arguments->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (0x20 < (ulong)((long)(arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12)) {
          uVar16 = 1;
          lVar20 = 0x28;
          do {
            std::__cxx11::string::_M_append
                      ((char *)local_110,*(ulong *)((long)pbVar12 + lVar20 + -8));
            pbVar12 = (arguments->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar15 = (long)(arguments->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5;
            if (uVar16 < uVar15 - 1) {
              std::__cxx11::string::append((char *)local_110);
              pbVar12 = (arguments->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar15 = (long)(arguments->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5;
            }
            uVar16 = uVar16 + 1;
            lVar20 = lVar20 + 0x20;
          } while (uVar16 < uVar15);
        }
        psVar4 = local_140;
        iVar5 = std::__cxx11::string::compare((char *)local_140);
        if (iVar5 == 0) {
          iVar6 = util::to_int((arguments->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1);
          iVar5 = (*from->_vptr_Command_Source[4])(from);
          pCVar10 = local_148;
          local_178._0_8_ = local_178 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"MaxLevel","");
          pmVar13 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)(CONCAT44(extraout_var_04,iVar5) + 0x198),(key_type *)local_178)
          ;
          iVar9 = util::variant::GetInt(pmVar13);
          iVar5 = 0;
          if (0 < iVar6) {
            iVar5 = iVar6;
          }
          uVar14 = (uchar)iVar5;
          if (iVar9 < iVar5) {
            uVar14 = (uchar)iVar9;
          }
          pCVar10->level = uVar14;
LAB_001218f5:
          if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
            operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
          }
          bVar21 = true;
LAB_00121ba5:
          Character::CalculateStats(pCVar10,true);
          PacketBuilder::PacketBuilder((PacketBuilder *)local_178,PACKET_RECOVER,PACKET_LIST,0x20);
          PacketBuilder::AddShort((PacketBuilder *)local_178,(uint)pCVar10->clas);
          PacketBuilder::AddShort((PacketBuilder *)local_178,*pCVar10->display_str);
          PacketBuilder::AddShort((PacketBuilder *)local_178,*pCVar10->display_intl);
          PacketBuilder::AddShort((PacketBuilder *)local_178,*pCVar10->display_wis);
          PacketBuilder::AddShort((PacketBuilder *)local_178,*pCVar10->display_agi);
          PacketBuilder::AddShort((PacketBuilder *)local_178,*pCVar10->display_con);
          PacketBuilder::AddShort((PacketBuilder *)local_178,*pCVar10->display_cha);
          PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->maxhp);
          PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->maxtp);
          PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->maxsp);
          PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->maxweight);
          PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->mindam);
          PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->maxdam);
          PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->accuracy);
          PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->evade);
          PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->armor);
          Character::Send(pCVar10,(PacketBuilder *)local_178);
          PacketBuilder::~PacketBuilder((PacketBuilder *)local_178);
          bVar3 = 0;
LAB_00121cd1:
          if ((bool)(bVar3 | bVar21)) {
            PacketBuilder::PacketBuilder((PacketBuilder *)local_178,PACKET_RECOVER,PACKET_REPLY,0xb)
            ;
            PacketBuilder::AddInt((PacketBuilder *)local_178,pCVar10->exp);
            PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->karma);
            uVar17 = 0;
            if (bVar21) {
              uVar17 = (uint)pCVar10->level;
            }
            PacketBuilder::AddChar((PacketBuilder *)local_178,uVar17);
            if (bVar21) {
              PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->statpoints);
              PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->skillpoints);
            }
            Character::Send(pCVar10,(PacketBuilder *)local_178);
            PacketBuilder::~PacketBuilder((PacketBuilder *)local_178);
          }
          Character::CheckQuestRules(pCVar10);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar5 == 0) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            pCVar10 = local_148;
            iVar5 = (*from->_vptr_Command_Source[4])(from);
            local_178._0_8_ = local_178 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"MaxExp","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_06,iVar5) + 0x198),
                                   (key_type *)local_178);
            iVar9 = util::variant::GetInt(pmVar13);
            iVar5 = 0;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
            if (iVar9 < iVar5) {
              iVar5 = iVar9;
            }
            pCVar10->exp = iVar5;
            goto LAB_001218f5;
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar5 == 0) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            pCVar10 = local_148;
            iVar5 = (*from->_vptr_Command_Source[4])(from);
            local_178._0_8_ = local_178 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"MaxStat","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_07,iVar5) + 0x198),
                                   (key_type *)local_178);
            iVar9 = util::variant::GetInt(pmVar13);
            iVar5 = 0;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
            if (iVar9 < iVar5) {
              iVar5 = iVar9;
            }
            pCVar10->str = iVar5;
LAB_00121b8c:
            if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
              operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
            }
            bVar21 = false;
            goto LAB_00121ba5;
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          pCVar10 = local_148;
          if (iVar5 == 0) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar5 = (*from->_vptr_Command_Source[4])(from);
            local_178._0_8_ = local_178 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"MaxStat","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_08,iVar5) + 0x198),
                                   (key_type *)local_178);
            iVar9 = util::variant::GetInt(pmVar13);
            iVar5 = 0;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
            if (iVar9 < iVar5) {
              iVar5 = iVar9;
            }
            pCVar10->intl = iVar5;
            goto LAB_00121b8c;
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar5 == 0) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar5 = (*from->_vptr_Command_Source[4])(from);
            local_178._0_8_ = local_178 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"MaxStat","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_09,iVar5) + 0x198),
                                   (key_type *)local_178);
            iVar9 = util::variant::GetInt(pmVar13);
            iVar5 = 0;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
            if (iVar9 < iVar5) {
              iVar5 = iVar9;
            }
            pCVar10->wis = iVar5;
            goto LAB_00121b8c;
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar5 == 0) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar5 = (*from->_vptr_Command_Source[4])(from);
            local_178._0_8_ = local_178 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"MaxStat","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_10,iVar5) + 0x198),
                                   (key_type *)local_178);
            iVar9 = util::variant::GetInt(pmVar13);
            iVar5 = 0;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
            if (iVar9 < iVar5) {
              iVar5 = iVar9;
            }
            pCVar10->agi = iVar5;
            goto LAB_00121b8c;
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar5 == 0) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar5 = (*from->_vptr_Command_Source[4])(from);
            local_178._0_8_ = local_178 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"MaxStat","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_11,iVar5) + 0x198),
                                   (key_type *)local_178);
            iVar9 = util::variant::GetInt(pmVar13);
            iVar5 = 0;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
            if (iVar9 < iVar5) {
              iVar5 = iVar9;
            }
            pCVar10->con = iVar5;
            goto LAB_00121b8c;
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar5 == 0) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar5 = (*from->_vptr_Command_Source[4])(from);
            local_178._0_8_ = local_178 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"MaxStat","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_12,iVar5) + 0x198),
                                   (key_type *)local_178);
            iVar9 = util::variant::GetInt(pmVar13);
            iVar5 = 0;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
            if (iVar9 < iVar5) {
              iVar5 = iVar9;
            }
            pCVar10->cha = iVar5;
            goto LAB_00121b8c;
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar5 == 0) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar5 = (*from->_vptr_Command_Source[4])(from);
            local_178._0_8_ = local_178 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"MaxLevel","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_13,iVar5) + 0x198),
                                   (key_type *)local_178);
            iVar9 = util::variant::GetInt(pmVar13);
            iVar5 = (*from->_vptr_Command_Source[4])(from);
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"StatPerLevel","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_14,iVar5) + 0x198),&local_130);
            iVar7 = util::variant::GetInt(pmVar13);
            iVar5 = 0;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
            if (iVar7 * iVar9 < iVar5) {
              iVar5 = iVar7 * iVar9;
            }
            pCVar10->statpoints = iVar5;
LAB_00121eed:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
              operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
            }
            PacketBuilder::PacketBuilder
                      ((PacketBuilder *)local_178,PACKET_RECOVER,PACKET_TARGET_GROUP,10);
            PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->statpoints);
            PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->skillpoints);
            PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->maxhp);
            PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->maxtp);
            PacketBuilder::AddShort((PacketBuilder *)local_178,pCVar10->maxsp);
            Character::Send(pCVar10,(PacketBuilder *)local_178);
            PacketBuilder::~PacketBuilder((PacketBuilder *)local_178);
LAB_00121f8c:
            bVar3 = 0;
            bVar21 = false;
            goto LAB_00121cd1;
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar5 == 0) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar5 = (*from->_vptr_Command_Source[4])(from);
            local_178._0_8_ = local_178 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"MaxLevel","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_15,iVar5) + 0x198),
                                   (key_type *)local_178);
            iVar9 = util::variant::GetInt(pmVar13);
            iVar5 = (*from->_vptr_Command_Source[4])(from);
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"SkillPerLevel","")
            ;
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_16,iVar5) + 0x198),&local_130);
            iVar7 = util::variant::GetInt(pmVar13);
            iVar5 = 0;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
            if (iVar7 * iVar9 < iVar5) {
              iVar5 = iVar7 * iVar9;
            }
            pCVar10->skillpoints = iVar5;
            goto LAB_00121eed;
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar5 == 0) {
            pWVar2 = pCVar10->world;
            psVar18 = (size_type *)(local_178 + 0x10);
            local_178._0_8_ = psVar18;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_178,"NoInteractDefaultAdmin","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pWVar2->config,(key_type *)local_178);
            local_134 = util::variant::GetInt(pmVar13);
            if ((size_type *)local_178._0_8_ != psVar18) {
              operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
            }
            pWVar2 = pCVar10->world;
            local_178._0_8_ = psVar18;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_178,"NoInteractDefault","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pWVar2->config,(key_type *)local_178);
            iVar5 = util::variant::GetInt(pmVar13);
            local_140 = (string *)CONCAT44(local_140._4_4_,iVar5);
            if ((size_type *)local_178._0_8_ != psVar18) {
              operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
            }
            pWVar2 = pCVar10->world;
            local_178._0_8_ = psVar18;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"hide","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pWVar2->admin_config,(key_type *)local_178);
            local_138 = util::variant::GetInt(pmVar13);
            if ((size_type *)local_178._0_8_ != psVar18) {
              operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
            }
            uVar8 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            uVar17 = 4;
            if ((byte)uVar8 < 4) {
              uVar17 = uVar8;
            }
            uVar19 = uVar17 & 0xff;
            if ((int)local_140 == 0) {
              bVar21 = false;
            }
            else {
              bVar21 = false;
              if ((local_134 <= (int)(uint)pCVar10->admin) &&
                 (bVar21 = false, (int)uVar19 < local_134)) {
                bVar21 = (local_148->nointeract & 1) == 0;
              }
            }
            iVar5 = (**from->_vptr_Command_Source)(from);
            if (((AdminLevel)iVar5 <= (AdminLevel)uVar17) ||
               (iVar5 = (*from->_vptr_Command_Source[3])(from),
               (bool)(local_148 == (Character *)CONCAT44(extraout_var_17,iVar5) | bVar21))) {
              iVar5 = (*from->_vptr_Command_Source[4])(from);
              local_178._0_8_ = psVar18;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_178,"command_access_denied","");
              I18N::Format<>(&local_d0,(I18N *)(CONCAT44(extraout_var_18,iVar5) + 0x490),
                             (string *)local_178);
              pCVar10 = local_148;
              (*from->_vptr_Command_Source[5])(from,&local_d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((size_type *)local_178._0_8_ != psVar18) {
LAB_001222b7:
                operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
              }
            }
            else {
              if ((((int)(uint)local_148->admin < local_134) && (local_134 <= (int)uVar19)) &&
                 ((local_148->nointeract & 1) == 0)) {
                local_148->nointeract = (int)local_140;
              }
              if ((local_138 <= (int)(uint)local_148->admin) && ((int)uVar19 < local_138)) {
                Character::Unhide(local_148,0x1f);
              }
              if ((byte)uVar8 == 0) {
                iVar5 = -1;
                if (local_148->admin != ADMIN_PLAYER) goto LAB_00122357;
              }
              else if (local_148->admin == ADMIN_PLAYER) {
                iVar5 = 1;
LAB_00122357:
                World::UpdateAdminCount(local_148->world,iVar5 + local_148->world->admin_count);
              }
              local_148->admin = (AdminLevel)uVar17;
              pCVar10 = local_148;
            }
            goto LAB_00121f8c;
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar5 == 0) {
            std::__cxx11::string::_M_assign((string *)&pCVar10->title);
            goto LAB_00121f8c;
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar5 == 0) {
            pbVar12 = (arguments->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(arguments->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12) < 0x21) {
              local_178._0_8_ = local_178 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"");
            }
            else {
              local_178._0_8_ = local_178 + 0x10;
              pcVar1 = pbVar12[1]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_178,pcVar1,pcVar1 + pbVar12[1]._M_string_length);
            }
            std::__cxx11::string::_M_assign((string *)&pCVar10->fiance);
            if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) goto LAB_001222b7;
            goto LAB_00121f8c;
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar5 == 0) {
            pbVar12 = (arguments->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(arguments->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12) < 0x21) {
              local_178._0_8_ = local_178 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"");
            }
            else {
              local_178._0_8_ = local_178 + 0x10;
              pcVar1 = pbVar12[1]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_178,pcVar1,pcVar1 + pbVar12[1]._M_string_length);
            }
            std::__cxx11::string::_M_assign((string *)&local_148->partner);
LAB_001223a9:
            if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
              operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
            }
            bVar3 = 0;
            bVar21 = false;
            pCVar10 = local_148;
            goto LAB_00121cd1;
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar5 == 0) {
            pbVar12 = (arguments->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(arguments->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12) < 0x21) {
              local_178._0_8_ = local_178 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"");
            }
            else {
              local_178._0_8_ = local_178 + 0x10;
              pcVar1 = pbVar12[1]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_178,pcVar1,pcVar1 + pbVar12[1]._M_string_length);
            }
            std::__cxx11::string::_M_assign((string *)&local_148->home);
            goto LAB_001223a9;
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar5 == 0) {
            iVar5 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            local_148->gender = 0 < iVar5;
LAB_00122533:
            pCVar10 = local_148;
            bVar3 = 0;
            Character::Warp(local_148,local_148->map->id,local_148->x,local_148->y,
                            WARP_ANIMATION_NONE);
            bVar21 = false;
            goto LAB_00121cd1;
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar5 == 0) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar5 = (*from->_vptr_Command_Source[4])(from);
            local_178._0_8_ = local_178 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"MaxHairStyle","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_19,iVar5) + 0x198),
                                   (key_type *)local_178);
            iVar9 = util::variant::GetInt(pmVar13);
            iVar5 = 0;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
            if (iVar9 < iVar5) {
              iVar5 = iVar9;
            }
            local_148->hairstyle = (uchar)iVar5;
LAB_00122518:
            if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
              operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
            }
            goto LAB_00122533;
          }
          iVar5 = std::__cxx11::string::compare((char *)local_140);
          if (iVar5 == 0) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar5 = (*from->_vptr_Command_Source[4])(from);
            local_178._0_8_ = local_178 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"MaxHairColor","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_20,iVar5) + 0x198),
                                   (key_type *)local_178);
            iVar9 = util::variant::GetInt(pmVar13);
            iVar5 = 0;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
            if (iVar9 < iVar5) {
              iVar5 = iVar9;
            }
            local_148->haircolor = (uchar)iVar5;
            goto LAB_00122518;
          }
          iVar5 = std::__cxx11::string::compare((char *)local_140);
          if (iVar5 == 0) {
            iVar6 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar5 = (*from->_vptr_Command_Source[4])(from);
            local_178._0_8_ = local_178 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"MaxSkin","");
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_21,iVar5) + 0x198),
                                   (key_type *)local_178);
            iVar9 = util::variant::GetInt(pmVar13);
            iVar5 = 0;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
            if (iVar9 < iVar5) {
              iVar5 = iVar9;
            }
            local_148->race = (Skin)iVar5;
            goto LAB_00122518;
          }
          iVar5 = std::__cxx11::string::compare((char *)local_140);
          if (iVar5 == 0) {
            iVar5 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            if (iVar5 < 1) {
              iVar5 = 0;
            }
            uVar14 = '\t';
            if (iVar5 < 9) {
              uVar14 = (uchar)iVar5;
            }
            local_148->guild_rank = uVar14;
            pCVar10 = local_148;
            goto LAB_00121f8c;
          }
          iVar5 = std::__cxx11::string::compare((char *)local_140);
          if (iVar5 == 0) {
            iVar5 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            bVar21 = false;
            if (iVar5 < 1) {
              iVar5 = 0;
            }
            if (1999 < iVar5) {
              iVar5 = 2000;
            }
            local_148->karma = iVar5;
            bVar3 = 1;
            pCVar10 = local_148;
            goto LAB_00121cd1;
          }
          iVar5 = std::__cxx11::string::compare((char *)local_140);
          if (iVar5 == 0) {
            iVar5 = util::to_int((arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar6 = (*from->_vptr_Command_Source[4])(from);
            lVar20 = *(long *)(CONCAT44(extraout_var_22,iVar6) + 0x178);
            iVar6 = (int)((ulong)(*(long *)(lVar20 + 0x10) - *(long *)(lVar20 + 8)) >> 3) *
                    -0x49249249 + -1;
            bVar21 = false;
            if (iVar5 < 1) {
              iVar5 = 0;
            }
            if (iVar6 < iVar5) {
              iVar5 = iVar6;
            }
            local_148->clas = (uchar)iVar5;
            pCVar10 = local_148;
            goto LAB_00121ba5;
          }
          iVar5 = (*from->_vptr_Command_Source[4])(from);
          local_178._0_8_ = local_178 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"invalid_setx","");
          I18N::Format<>(&local_f0,(I18N *)(CONCAT44(extraout_var_03,iVar5) + 0x490),
                         (string *)local_178);
          (*from->_vptr_Command_Source[5])(from,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
            operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
          }
        }
        local_178._16_8_ = local_100[0];
        psVar18 = local_110[0];
        if (local_110[0] == local_100) {
          return;
        }
        goto LAB_0012139c;
      }
      iVar5 = (*from->_vptr_Command_Source[4])(from);
      local_178._0_8_ = local_178 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"command_access_denied","");
      I18N::Format<>(&local_b0,(I18N *)(CONCAT44(extraout_var_05,iVar5) + 0x490),(string *)local_178
                    );
      (*from->_vptr_Command_Source[5])(from,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_00121386;
    }
    else {
      iVar5 = (*from->_vptr_Command_Source[4])(from);
      local_178._0_8_ = local_178 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"command_access_denied","");
      I18N::Format<>(&local_90,(I18N *)(CONCAT44(extraout_var_02,iVar5) + 0x490),(string *)local_178
                    );
      (*from->_vptr_Command_Source[5])(from,&local_90);
      local_b0.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
      local_b0._M_dataplus._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_00121386;
    }
  }
  psVar18 = (size_type *)local_178._0_8_;
  if ((undefined1 *)local_178._0_8_ == local_178 + 0x10) {
    return;
  }
LAB_0012139c:
  operator_delete(psVar18,local_178._16_8_ + 1);
  return;
}

Assistant:

void SetX(const std::vector<std::string>& arguments, Command_Source* from, std::string set)
{
	Character *victim = from->SourceWorld()->GetCharacter(arguments[0]);
	Character *from_character = from->SourceCharacter();

	if (!victim || victim->nowhere)
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("character_not_found"));
	}
	else if (victim->SourceAccess() >= from->SourceAccess() && victim != from_character)
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
	}
	else if (from_character && from_character != victim && !from_character->CanInteractCharMod())
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
	}
	else
	{
		std::string title_string = "";

		for (std::size_t i = 1; i < arguments.size(); ++i)
		{
			title_string += arguments[i];

			if (i < arguments.size() - 1)
				title_string += " ";
		}

		bool appearance = false;
		bool failure = false;
		bool level = false;
		bool stats = false;
		bool karma = false;

		bool statpoints = false;
		bool skillpoints = false;

			 if (set == "level") (level = true, victim->level) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxLevel"]));
		else if (set == "exp") (level = true, victim->exp) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxExp"]));
		else if (set == "str") (stats = true, victim->str) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "int") (stats = true, victim->intl) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "wis") (stats = true, victim->wis) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "agi") (stats = true, victim->agi) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "con") (stats = true, victim->con) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "cha") (stats = true, victim->cha) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "statpoints") (statpoints = true, victim->statpoints) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxLevel"]) * int(from->SourceWorld()->config["StatPerLevel"]));
		else if (set == "skillpoints") (skillpoints = true, victim->skillpoints) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxLevel"]) * int(from->SourceWorld()->config["SkillPerLevel"]));
		else if (set == "admin")
		{
			int no_interact_default_admin = victim->world->config["NoInteractDefaultAdmin"];
			int no_interact_default = victim->world->config["NoInteractDefault"];
			int hide_level = victim->world->admin_config["hide"];

			AdminLevel level = std::min(std::max(AdminLevel(util::to_int(arguments[1])), ADMIN_PLAYER), ADMIN_HGM);

			// Avoid granting a player more privilege by lowering their admin level
			bool would_privilege = (no_interact_default != 0) && (victim->admin >= no_interact_default_admin)
			                    && (level < no_interact_default_admin) && !(victim->nointeract & Character::NoInteractCustom);

			if (level < from->SourceAccess() && victim != from->SourceCharacter() && !would_privilege)
			{
				if (victim->admin < no_interact_default_admin && level >= no_interact_default_admin
				 && !(victim->nointeract & Character::NoInteractCustom))
				{
					victim->nointeract = no_interact_default;
				}

				if (victim->admin >= hide_level && level < hide_level)
					victim->Unhide(Character::HideAll);

				if (level == ADMIN_PLAYER && victim->admin != ADMIN_PLAYER)
					victim->world->DecAdminCount();
				else if (level != ADMIN_PLAYER && victim->admin == ADMIN_PLAYER)
					victim->world->IncAdminCount();

				victim->admin = level;
			}
			else
			{
				from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
			}
		}
		else if (set == "title") victim->title = title_string;
		else if (set == "fiance") victim->fiance = (arguments.size() > 1) ? arguments[1] : "";
		else if (set == "partner") victim->partner = (arguments.size() > 1) ? arguments[1] : "";
		else if (set == "home") victim->home = (arguments.size() > 1) ? arguments[1] : "";
		else if (set == "gender") (appearance = true, victim->gender) = Gender(std::min(std::max(util::to_int(arguments[1]), 0), 1));
		else if (set == "hairstyle") (appearance = true, victim->hairstyle) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxHairStyle"]));
		else if (set == "haircolor") (appearance = true, victim->haircolor) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxHairColor"]));
		else if (set == "race") (appearance = true, victim->race) = Skin(std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxSkin"])));
		else if (set == "guildrank") victim->guild_rank = std::min(std::max(util::to_int(arguments[1]), 0), 9);
		else if (set == "karma") (karma = true, victim->karma) = std::min(std::max(util::to_int(arguments[1]), 0), 2000);
		else if (set == "class") (stats = true, victim->clas) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->ecf->data.size() - 1));
		else failure = true;

		if (failure)
		{
			from->ServerMsg(from->SourceWorld()->i18n.Format("invalid_setx"));
		}
		else
		{
			// Easiest way to get the character to update on everyone nearby's screen
			if (appearance)
				victim->Warp(victim->map->id, victim->x, victim->y);

			if (statpoints || skillpoints)
			{
				PacketBuilder builder(PACKET_RECOVER, PACKET_TARGET_GROUP, 10);
				builder.AddShort(victim->statpoints);
				builder.AddShort(victim->skillpoints);
				builder.AddShort(victim->maxhp);
				builder.AddShort(victim->maxtp);
				builder.AddShort(victim->maxsp);
				victim->Send(builder);
			}

			if (level || stats)
			{
				victim->CalculateStats();

				PacketBuilder builder(PACKET_RECOVER, PACKET_LIST, 32);
				builder.AddShort(victim->clas);
				builder.AddShort(victim->display_str);
				builder.AddShort(victim->display_intl);
				builder.AddShort(victim->display_wis);
				builder.AddShort(victim->display_agi);
				builder.AddShort(victim->display_con);
				builder.AddShort(victim->display_cha);
				builder.AddShort(victim->maxhp);
				builder.AddShort(victim->maxtp);
				builder.AddShort(victim->maxsp);
				builder.AddShort(victim->maxweight);
				builder.AddShort(victim->mindam);
				builder.AddShort(victim->maxdam);
				builder.AddShort(victim->accuracy);
				builder.AddShort(victim->evade);
				builder.AddShort(victim->armor);
				victim->Send(builder);
			}

			if (karma || level)
			{
				PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 11);
				builder.AddInt(victim->exp);
				builder.AddShort(victim->karma);
				builder.AddChar(level ? victim->level : 0);
				if (level)
				{
					builder.AddShort(victim->statpoints);
					builder.AddShort(victim->skillpoints);
				}
				victim->Send(builder);
			}

			victim->CheckQuestRules();
		}
	}
}